

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_loop_interp(jit_State *J,BCIns *pc,LoopEvent ev)

{
  int iVar1;
  TraceLink in_EDX;
  jit_State *in_RSI;
  jit_State *in_RDI;
  TraceNo in_stack_ffffffffffffffe8;
  
  if ((in_RDI->parent == 0) && (in_RDI->exitno == 0)) {
    if ((in_RSI == (jit_State *)in_RDI->startpc) && (in_RDI->framedepth + in_RDI->retdepth == 0)) {
      if (in_EDX == LJ_TRLINK_NONE) {
        lj_trace_err(in_RSI,LJ_TRERR_RECERR);
      }
      lj_record_stop(in_RSI,in_EDX,in_stack_ffffffffffffffe8);
    }
    else if (in_EDX != LJ_TRLINK_NONE) {
      if (((in_RSI->cur).nextgc.gcptr32 >> 0x10 != 0x7fff) &&
         (iVar1 = innerloopleft(in_RDI,(BCIns *)in_RSI), iVar1 == 0)) {
        lj_trace_err(in_RSI,in_EDX);
      }
      if ((((in_EDX != LJ_TRLINK_ROOT) && (in_RDI->loopref != 0)) &&
          (0x18 < (in_RDI->cur).nins - in_RDI->loopref)) ||
         (iVar1 = in_RDI->loopunroll + -1, in_RDI->loopunroll = iVar1, iVar1 < 0)) {
        lj_trace_err(in_RSI,in_EDX);
      }
      in_RDI->loopref = (in_RDI->cur).nins;
    }
  }
  else if (in_EDX != LJ_TRLINK_NONE) {
    in_RDI->loopref = (in_RDI->cur).nins;
    iVar1 = in_RDI->loopunroll + -1;
    in_RDI->loopunroll = iVar1;
    if (iVar1 < 0) {
      lj_trace_err(in_RSI,in_EDX);
    }
  }
  return;
}

Assistant:

static void rec_loop_interp(jit_State *J, const BCIns *pc, LoopEvent ev)
{
  if (J->parent == 0 && J->exitno == 0) {
    if (pc == J->startpc && J->framedepth + J->retdepth == 0) {
      /* Same loop? */
      if (ev == LOOPEV_LEAVE)  /* Must loop back to form a root trace. */
	lj_trace_err(J, LJ_TRERR_LLEAVE);
      lj_record_stop(J, LJ_TRLINK_LOOP, J->cur.traceno);  /* Looping trace. */
    } else if (ev != LOOPEV_LEAVE) {  /* Entering inner loop? */
      /* It's usually better to abort here and wait until the inner loop
      ** is traced. But if the inner loop repeatedly didn't loop back,
      ** this indicates a low trip count. In this case try unrolling
      ** an inner loop even in a root trace. But it's better to be a bit
      ** more conservative here and only do it for very short loops.
      */
      if (bc_j(*pc) != -1 && !innerloopleft(J, pc))
	lj_trace_err(J, LJ_TRERR_LINNER);  /* Root trace hit an inner loop. */
      if ((ev != LOOPEV_ENTERLO &&
	   J->loopref && J->cur.nins - J->loopref > 24) || --J->loopunroll < 0)
	lj_trace_err(J, LJ_TRERR_LUNROLL);  /* Limit loop unrolling. */
      J->loopref = J->cur.nins;
    }
  } else if (ev != LOOPEV_LEAVE) {  /* Side trace enters an inner loop. */
    J->loopref = J->cur.nins;
    if (--J->loopunroll < 0)
      lj_trace_err(J, LJ_TRERR_LUNROLL);  /* Limit loop unrolling. */
  }  /* Side trace continues across a loop that's left or not entered. */
}